

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> * __thiscall
kj::_::NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>::operator=
          (NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *this,
          NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *other)

{
  Promise<kj::AsyncCapabilityStream::ReadResult> *params;
  NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *other_local;
  NullableValue<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Promise<kj::AsyncCapabilityStream::ReadResult>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Promise<kj::AsyncCapabilityStream::ReadResult>>(&(other->field_1).value);
      ctor<kj::Promise<kj::AsyncCapabilityStream::ReadResult>,kj::Promise<kj::AsyncCapabilityStream::ReadResult>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }